

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZSpectralTransform.cpp
# Opt level: O0

TPZAutoPointer<TPZMatrix<float>_> __thiscall
TPZSTShiftAndInvert<float>::CalcMatrix
          (TPZSTShiftAndInvert<float> *this,TPZAutoPointer<TPZMatrix<float>_> *A,
          TPZAutoPointer<TPZMatrix<float>_> *B)

{
  int iVar1;
  int64_t iVar2;
  int64_t iVar3;
  TPZMatrix<float> *pTVar4;
  TPZMatrix<float> *in_RCX;
  TPZFMatrix<float> *in_RDX;
  TPZSTShiftOrigin<float> *in_RSI;
  TPZReference *in_RDI;
  size_t in_stack_00000068;
  char *in_stack_00000070;
  float *shift;
  TPZAutoPointer<TPZMatrix<float>_> *shiftedMat;
  TPZAutoPointer<TPZMatrix<float>_> *in_stack_fffffffffffffc48;
  TPZAutoPointer<TPZMatrix<float>_> *in_stack_fffffffffffffc50;
  float in_stack_fffffffffffffc64;
  TPZFMatrix<float> *in_stack_fffffffffffffc68;
  TPZMatrix<float> *in_stack_fffffffffffffc78;
  TPZBaseMatrix local_178 [5];
  TPZBaseMatrix local_d0 [4];
  float local_34;
  float *local_30;
  undefined1 local_21;
  
  local_21 = 0;
  TPZAutoPointer<TPZMatrix<float>_>::TPZAutoPointer
            (in_stack_fffffffffffffc50,in_stack_fffffffffffffc48);
  local_34 = TPZSTShiftOrigin<float>::Shift(in_RSI);
  local_30 = &local_34;
  TPZAutoPointer<TPZMatrix<float>_>::operator->((TPZAutoPointer<TPZMatrix<float>_> *)in_RDI);
  TPZMatrix<float>::Storage(in_stack_fffffffffffffc78);
  iVar2 = TPZBaseMatrix::Rows(local_d0);
  TPZAutoPointer<TPZMatrix<float>_>::operator->((TPZAutoPointer<TPZMatrix<float>_> *)in_RCX);
  TPZMatrix<float>::Storage(in_stack_fffffffffffffc78);
  iVar3 = TPZBaseMatrix::Rows(local_178);
  TPZFMatrixRef<float>::~TPZFMatrixRef((TPZFMatrixRef<float> *)0x11ba212);
  TPZFMatrixRef<float>::~TPZFMatrixRef((TPZFMatrixRef<float> *)0x11ba21f);
  if (iVar2 != iVar3) {
    std::operator<<((ostream *)&std::cerr,
                    "virtual TPZAutoPointer<TPZMatrix<TVar>> TPZSTShiftAndInvert<float>::CalcMatrix(TPZAutoPointer<TPZMatrix<TVar>>, TPZAutoPointer<TPZMatrix<TVar>>) const [TVar = float]"
                   );
    std::operator<<((ostream *)&std::cerr,
                    "\nERROR: Matrices have uncompatible storage formats.\nAborting...\n");
    pzinternal::DebugStopImpl(in_stack_00000070,in_stack_00000068);
  }
  pTVar4 = TPZAutoPointer<TPZMatrix<float>_>::operator->
                     ((TPZAutoPointer<TPZMatrix<float>_> *)in_RCX);
  TPZMatrix<float>::Storage(pTVar4);
  TPZFMatrix<float>::operator*(in_stack_fffffffffffffc68,in_stack_fffffffffffffc64);
  TPZAutoPointer<TPZMatrix<float>_>::operator->((TPZAutoPointer<TPZMatrix<float>_> *)in_RDI);
  TPZMatrix<float>::Storage(pTVar4);
  TPZFMatrix<float>::operator-=(in_RDX,in_RCX);
  TPZFMatrixRef<float>::~TPZFMatrixRef((TPZFMatrixRef<float> *)0x11ba364);
  TPZFMatrix<float>::~TPZFMatrix((TPZFMatrix<float> *)0x11ba371);
  TPZFMatrixRef<float>::~TPZFMatrixRef((TPZFMatrixRef<float> *)0x11ba37e);
  pTVar4 = TPZAutoPointer<TPZMatrix<float>_>::operator->
                     ((TPZAutoPointer<TPZMatrix<float>_> *)in_RDI);
  iVar1 = (*(pTVar4->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x10])();
  if (iVar1 == 0) {
    pTVar4 = TPZAutoPointer<TPZMatrix<float>_>::operator->
                       ((TPZAutoPointer<TPZMatrix<float>_> *)in_RDI);
    (*(pTVar4->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x17])();
  }
  else {
    pTVar4 = TPZAutoPointer<TPZMatrix<float>_>::operator->
                       ((TPZAutoPointer<TPZMatrix<float>_> *)in_RDI);
    (*(pTVar4->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x1b])();
  }
  return (TPZAutoPointer<TPZMatrix<float>_>)in_RDI;
}

Assistant:

TPZAutoPointer<TPZMatrix<TVar>>
TPZSTShiftAndInvert<TVar>::CalcMatrix(TPZAutoPointer<TPZMatrix<TVar>>A, TPZAutoPointer<TPZMatrix<TVar>>B) const
{
  TPZAutoPointer<TPZMatrix<TVar>> shiftedMat = A;
  const auto &shift = this->Shift();
  if(shiftedMat->Storage().Rows() != B->Storage().Rows()){
    PZError<<__PRETTY_FUNCTION__;
    PZError<<"\nERROR: Matrices have uncompatible storage formats.\nAborting...\n";
    DebugStop();
  }
  shiftedMat->Storage() -= B->Storage() * shift;

  if (shiftedMat->IsSymmetric()) shiftedMat->Decompose_LDLt();
  else shiftedMat->Decompose_LU();
  return shiftedMat;
}